

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_log.cpp
# Opt level: O0

int miniros::file_log::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  ulong uVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *pcVar7;
  char pid_str [100];
  size_t i;
  path log_file_name_1;
  path dotros;
  string ros_log_env;
  pid_t pid;
  const_iterator it;
  string log_file_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffb08;
  path *in_stack_fffffffffffffb10;
  path *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  path *in_stack_fffffffffffffb30;
  path *in_stack_fffffffffffffb38;
  path *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  allocator<char> *in_stack_fffffffffffffb60;
  format fVar8;
  undefined7 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6f;
  path *in_stack_fffffffffffffb70;
  char *in_stack_fffffffffffffb80;
  string local_400 [72];
  path local_3b8;
  undefined1 local_390 [40];
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  char local_2b8 [112];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  allocator<char> local_239;
  string local_238 [72];
  path local_1f0;
  allocator<char> local_1c1;
  string local_1c0 [112];
  path local_150;
  undefined1 local_121 [33];
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [32];
  string local_b8 [32];
  string local_98;
  uint local_74;
  _Self local_70 [3];
  allocator<char> local_51;
  string local_50 [32];
  _Self local_30;
  string local_28 [32];
  EVP_PKEY_CTX *local_8;
  
  local_8 = ctx;
  std::__cxx11::string::string(local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
             (allocator<char> *)in_stack_fffffffffffffb40);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffb08,(key_type *)0x41cdc4);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffb08);
  bVar1 = std::operator!=(&local_30,local_70);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x41ce38);
    std::__cxx11::string::operator=(local_28,(string *)&ppVar3->second);
  }
  uVar4 = std::__cxx11::string::empty();
  fVar8 = (format)((ulong)in_stack_fffffffffffffb60 >> 0x38);
  if ((uVar4 & 1) != 0) {
    local_74 = getpid();
    psVar5 = &local_98;
    std::__cxx11::string::string((string *)psVar5);
    bVar1 = get_environment_variable(psVar5,in_stack_fffffffffffffb80);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                 (allocator<char> *)in_stack_fffffffffffffb40);
      std::operator+(in_stack_fffffffffffffb18,&in_stack_fffffffffffffb10->_M_pathname);
      std::__cxx11::string::operator=(local_28,local_b8);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
    }
    else {
      bVar1 = get_environment_variable(psVar5,in_stack_fffffffffffffb80);
      if (bVar1) {
        in_stack_fffffffffffffb70 = (path *)local_121;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                   (allocator<char> *)in_stack_fffffffffffffb40);
        std::operator+(in_stack_fffffffffffffb18,&in_stack_fffffffffffffb10->_M_pathname);
        std::__cxx11::string::operator=(local_28,local_100);
        std::__cxx11::string::~string(local_100);
        std::__cxx11::string::~string((string *)(local_121 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_121);
      }
      else {
        in_stack_fffffffffffffb6f = get_environment_variable(psVar5,in_stack_fffffffffffffb80);
        if ((bool)in_stack_fffffffffffffb6f) {
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (in_stack_fffffffffffffb70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
                     (format)((ulong)in_stack_fffffffffffffb60 >> 0x38));
          in_stack_fffffffffffffb60 = &local_1c1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                     (allocator<char> *)in_stack_fffffffffffffb40);
          std::filesystem::__cxx11::path::path
                    (in_stack_fffffffffffffb40,&in_stack_fffffffffffffb38->_M_pathname,
                     (format)((ulong)in_stack_fffffffffffffb30 >> 0x38));
          std::filesystem::__cxx11::operator/(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
          std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb10);
          std::__cxx11::string::~string(local_1c0);
          std::allocator<char>::~allocator(&local_1c1);
          std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb10);
          std::filesystem::create_directory(&local_150);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                     (allocator<char> *)in_stack_fffffffffffffb40);
          std::filesystem::__cxx11::path::path
                    (in_stack_fffffffffffffb40,&in_stack_fffffffffffffb38->_M_pathname,
                     (format)((ulong)in_stack_fffffffffffffb30 >> 0x38));
          std::filesystem::__cxx11::operator/(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
          std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb10);
          std::__cxx11::string::~string(local_238);
          std::allocator<char>::~allocator(&local_239);
          std::filesystem::create_directory(&local_1f0);
          std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb10);
          std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb10);
        }
      }
    }
    local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    while( true ) {
      __lhs = local_248;
      psVar5 = this_node::getName_abi_cxx11_();
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::length();
      fVar8 = (format)((ulong)in_stack_fffffffffffffb60 >> 0x38);
      if (pbVar6 <= __lhs) break;
      in_stack_fffffffffffffb40 = (path *)this_node::getName_abi_cxx11_();
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)in_stack_fffffffffffffb40);
      iVar2 = isalnum((int)*pcVar7);
      if (iVar2 == 0) {
        std::__cxx11::string::operator+=(local_28,'_');
      }
      else {
        in_stack_fffffffffffffb38 = (path *)this_node::getName_abi_cxx11_();
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)in_stack_fffffffffffffb38);
        std::__cxx11::string::operator+=(local_28,*pcVar7);
      }
      local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &local_248->field_0x1;
    }
    snprintf(local_2b8,100,"%d",(ulong)local_74);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar5,(char *)__lhs,(allocator<char> *)in_stack_fffffffffffffb40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar5,(char *)__lhs,(allocator<char> *)in_stack_fffffffffffffb40);
    std::operator+(__lhs,&in_stack_fffffffffffffb40->_M_pathname);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar5,(char *)__lhs,(allocator<char> *)in_stack_fffffffffffffb40);
    std::operator+(__lhs,&in_stack_fffffffffffffb40->_M_pathname);
    std::__cxx11::string::operator+=(local_28,local_2d8);
    std::__cxx11::string::~string(local_2d8);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator((allocator<char> *)(local_390 + 0x27));
    std::__cxx11::string::~string(local_2f8);
    std::__cxx11::string::~string(local_340);
    std::allocator<char>::~allocator(&local_341);
    std::__cxx11::string::~string(local_318);
    std::allocator<char>::~allocator(&local_319);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_fffffffffffffb70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),fVar8);
  std::filesystem::absolute(&local_3b8);
  std::filesystem::__cxx11::path::string(in_stack_fffffffffffffb38);
  this = (path *)local_390;
  std::__cxx11::string::operator=(local_28,(string *)this);
  std::__cxx11::string::~string((string *)this);
  std::filesystem::__cxx11::path::~path(this);
  std::filesystem::__cxx11::path::~path(this);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_fffffffffffffb70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),fVar8);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::string(in_stack_fffffffffffffb38);
  std::__cxx11::string::operator=((string *)g_log_directory_abi_cxx11_,local_400);
  std::__cxx11::string::~string(local_400);
  std::filesystem::__cxx11::path::~path(this);
  std::filesystem::__cxx11::path::~path(this);
  iVar2 = std::__cxx11::string::~string(local_28);
  return iVar2;
}

Assistant:

void init(const M_string& remappings)
{
  std::string log_file_name;
  M_string::const_iterator it = remappings.find("__log");
  if (it != remappings.end())
  {
    log_file_name = it->second;
  }

  {
    // Log filename can be specified on the command line through __log
    // If it's been set, don't create our own name
    if (log_file_name.empty())
    {
      // Setup the logfile appender
      // Can't do this in rosconsole because the node name is not known
      pid_t pid = getpid();
      std::string ros_log_env;
      if ( get_environment_variable(ros_log_env, "ROS_LOG_DIR"))
      {
        log_file_name = ros_log_env + std::string("/");
      }
      else
      {
        if ( get_environment_variable(ros_log_env, "ROS_HOME"))
        {
          log_file_name = ros_log_env + std::string("/log/");
        }
        else
        {
          // Not cross-platform?
          if( get_environment_variable(ros_log_env, "HOME") )
          {
            fs::path dotros = fs::path(ros_log_env) / std::string(".ros");
            fs::create_directory(dotros);
            fs::path log_file_name = dotros / std::string("log");
            fs::create_directory(log_file_name);
          }
        }
      }

      // sanitize the node name and tack it to the filename
      for (size_t i = 1; i < this_node::getName().length(); i++)
      {
        if (!isalnum(this_node::getName()[i]))
        {
          log_file_name += '_';
        }
        else
        {
          log_file_name += this_node::getName()[i];
        }
      }

      char pid_str[100];
      std::snprintf(pid_str, sizeof(pid_str), "%d", pid);
      log_file_name += std::string("_") + std::string(pid_str) + std::string(".log");
    }

    log_file_name = fs::absolute(log_file_name).string();
    g_log_directory = fs::path(log_file_name).parent_path().string();
  }
}